

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O3

uint __thiscall
ThreeWiseHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (ThreeWiseHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  _Elt_pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar4 = 0;
  puVar7 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 ((((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar2));
  if (puVar7 != (_Elt_pointer)0x0) {
    lVar6 = *(long *)(this + 0x60);
    uVar8 = (long)puVar2 -
            (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    puVar7 = puVar7 + (puVar7 == (_Elt_pointer)0x0);
    lVar5 = 0;
    uVar4 = 0;
    do {
      if ((long)uVar8 < 0) {
        uVar9 = (long)uVar8 >> 9;
LAB_00109809:
        pbVar10 = ppuVar3[uVar9] + uVar8 + uVar9 * -0x200;
      }
      else {
        if (0x1ff < uVar8) {
          uVar9 = uVar8 >> 9;
          goto LAB_00109809;
        }
        pbVar10 = puVar2 + lVar5;
      }
      uVar4 = uVar4 ^ *(uint *)(lVar6 + (ulong)*pbVar10 * 4);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x400;
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + -1;
    } while (puVar7 != (_Elt_pointer)0x0);
  }
  return uVar4;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (size_t k = 0; k < c.size(); ++k) {
      answer ^= hashers[k].hashvalues[c[k]];
    }
    return answer;
  }